

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_memory.cpp
# Opt level: O0

ObjInfo * __thiscall GCHeap::find(GCHeap *this,void *ptr)

{
  ObjInfo *local_28;
  ObjInfo *obj;
  void *ptr_local;
  GCHeap *this_local;
  
  Mutex::EnterCriticalSection();
  local_28 = TypedList<GCHeap::ObjInfo>::getHead(&this->mObjects);
  while( true ) {
    if (local_28 == (ObjInfo *)0x0) {
      Mutex::ExitCriticalSection();
      return (ObjInfo *)0x0;
    }
    if ((local_28->ptr <= ptr) && (ptr < (void *)((long)local_28->ptr + (ulong)local_28->size)))
    break;
    local_28 = TypedList<GCHeap::ObjInfo>::next(&this->mObjects,local_28);
  }
  Mutex::ExitCriticalSection();
  return local_28;
}

Assistant:

GCHeap::ObjInfo *GCHeap::find( void *ptr )
{
	Mutex::EnterCriticalSection();
	ObjInfo *obj = mObjects.getHead();
	while ( obj != NULL )
	{
		if ( ptr >= obj->ptr && (uint8_t*)ptr < (uint8_t*)obj->ptr + obj->size )
		{
			Mutex::ExitCriticalSection();
			return obj;
		}

		obj = mObjects.next( obj );
	}

	Mutex::ExitCriticalSection();

	return NULL;
}